

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_bitmap.cpp
# Opt level: O0

void addTests_Bitmap(UnitTestFramework *framework)

{
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string *in_stack_ffffffffffffffa0;
  testFunction in_stack_ffffffffffffffa8;
  UnitTestFramework *in_stack_ffffffffffffffb0;
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"Save and load white gray-scale image",&local_29);
  UnitTestFramework::add
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffa0,"Save and load black gray-scale image",&local_61);
  UnitTestFramework::add
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"Save and load random RGB image",&local_89);
  UnitTestFramework::add
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  return;
}

Assistant:

void addTests_Bitmap( UnitTestFramework & framework )
{
    framework.add(bitmap_operation::WhiteGrayScaleImage, "Save and load white gray-scale image");
    framework.add(bitmap_operation::BlackGrayScaleImage, "Save and load black gray-scale image");
    framework.add(bitmap_operation::RandomRGBImage,      "Save and load random RGB image");
}